

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
          (QMovableArrayOps<QCss::BasicSelector> *this,qsizetype i,BasicSelector *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  BasicSelector *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  BasicSelector tmp;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  byte bVar6;
  BasicSelector *this_00;
  Inserter local_98;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QCss::BasicSelector>::needsDetach
                    ((QArrayDataPointer<QCss::BasicSelector> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->elementName).d.size) &&
       (qVar3 = QArrayDataPointer<QCss::BasicSelector>::freeSpaceAtEnd
                          ((QArrayDataPointer<QCss::BasicSelector> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                                   CONCAT24(in_stack_ffffffffffffff4c,
                                                            in_stack_ffffffffffffff48)))),
       qVar3 != 0)) {
      QArrayDataPointer<QCss::BasicSelector>::end((QArrayDataPointer<QCss::BasicSelector> *)in_RDI);
      QCss::BasicSelector::BasicSelector
                (in_RDI,(BasicSelector *)
                        CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      (in_RDI->elementName).d.size = (in_RDI->elementName).d.size + 1;
      goto LAB_00484488;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<QCss::BasicSelector>::freeSpaceAtBegin
                          ((QArrayDataPointer<QCss::BasicSelector> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff4e,
                                                   CONCAT24(in_stack_ffffffffffffff4c,
                                                            in_stack_ffffffffffffff48)))),
       qVar3 != 0)) {
      QArrayDataPointer<QCss::BasicSelector>::begin
                ((QArrayDataPointer<QCss::BasicSelector> *)0x48435a);
      QCss::BasicSelector::BasicSelector
                (in_RDI,(BasicSelector *)
                        CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      (in_RDI->elementName).d.ptr = (in_RDI->elementName).d.ptr + -0x34;
      (in_RDI->elementName).d.size = (in_RDI->elementName).d.size + 1;
      goto LAB_00484488;
    }
  }
  memset(local_70,0xaa,0x68);
  QCss::BasicSelector::BasicSelector
            (in_RDI,(BasicSelector *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  bVar4 = (in_RDI->elementName).d.size != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<QCss::BasicSelector>::detachAndGrow
            ((QArrayDataPointer<QCss::BasicSelector> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (BasicSelector **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff4c,uVar2))),
             (QArrayDataPointer<QCss::BasicSelector> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QCss::BasicSelector> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff4c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff38));
    Inserter::insertOne((Inserter *)in_RDI,
                        (BasicSelector *)CONCAT17(uVar5,in_stack_ffffffffffffff38));
    Inserter::~Inserter(&local_98);
  }
  else {
    QArrayDataPointer<QCss::BasicSelector>::begin
              ((QArrayDataPointer<QCss::BasicSelector> *)0x48441c);
    QCss::BasicSelector::BasicSelector
              (in_RDI,(BasicSelector *)CONCAT17(uVar5,in_stack_ffffffffffffff38));
    (in_RDI->elementName).d.ptr = (in_RDI->elementName).d.ptr + -0x34;
    (in_RDI->elementName).d.size = (in_RDI->elementName).d.size + 1;
  }
  QCss::BasicSelector::~BasicSelector(in_RDI);
LAB_00484488:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }